

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_algorithm_t psa_key_policy_algorithm_intersection(psa_algorithm_t alg1,psa_algorithm_t alg2)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  psa_algorithm_t alg2_local;
  psa_algorithm_t alg1_local;
  
  if (alg1 == alg2) {
    return alg1;
  }
  if ((((((alg1 & 0xffffff00) == 0x10030000) || ((alg1 & 0xffffff00) == 0x10020000)) ||
       ((alg1 & 0xfffeff00) == 0x10040000)) || ((alg1 & 0xfffeff00) == 0x10060000)) &&
     (((((alg2 & 0xffffff00) == 0x10030000 || ((alg2 & 0xffffff00) == 0x10020000)) ||
       (((alg2 & 0xfffeff00) == 0x10040000 || ((alg2 & 0xfffeff00) == 0x10060000)))) &&
      ((alg1 & 0xffffff00) == (alg2 & 0xffffff00))))) {
    if ((((alg1 & 0xffffff00) == 0x10030000) || ((alg1 & 0xffffff00) == 0x10020000)) ||
       (((alg1 & 0xfffeff00) == 0x10040000 || ((alg1 & 0xfffeff00) == 0x10060000)))) {
      if ((alg1 & 0xff) == 0) {
        local_18 = 0;
      }
      else {
        local_18 = alg1 & 0xff | 0x1000000;
      }
      local_1c = local_18;
    }
    else {
      local_1c = 0;
    }
    if (local_1c == 0x10000ff) {
      return alg2;
    }
    if (((((alg2 & 0xffffff00) == 0x10030000) || ((alg2 & 0xffffff00) == 0x10020000)) ||
        ((alg2 & 0xfffeff00) == 0x10040000)) || ((alg2 & 0xfffeff00) == 0x10060000)) {
      if ((alg2 & 0xff) == 0) {
        local_20 = 0;
      }
      else {
        local_20 = alg2 & 0xff | 0x1000000;
      }
      local_24 = local_20;
    }
    else {
      local_24 = 0;
    }
    if (local_24 == 0x10000ff) {
      return alg1;
    }
  }
  return 0;
}

Assistant:

static psa_algorithm_t psa_key_policy_algorithm_intersection(
    psa_algorithm_t alg1,
    psa_algorithm_t alg2 )
{
    /* Common case: both sides actually specify the same policy. */
    if( alg1 == alg2 )
        return( alg1 );
    /* If the policies are from the same hash-and-sign family, check
     * if one is a wildcard. If so the other has the specific algorithm. */
    if( PSA_ALG_IS_HASH_AND_SIGN( alg1 ) &&
        PSA_ALG_IS_HASH_AND_SIGN( alg2 ) &&
        ( alg1 & ~PSA_ALG_HASH_MASK ) == ( alg2 & ~PSA_ALG_HASH_MASK ) )
    {
        if( PSA_ALG_SIGN_GET_HASH( alg1 ) == PSA_ALG_ANY_HASH )
            return( alg2 );
        if( PSA_ALG_SIGN_GET_HASH( alg2 ) == PSA_ALG_ANY_HASH )
            return( alg1 );
    }
    /* If the policies are incompatible, allow nothing. */
    return( 0 );
}